

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O3

void Eigen::internal::queryCacheSizes(int *l1,int *l2,int *l3)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  uint uVar8;
  bool bVar9;
  
  lVar1 = cpuid_basic_info(0);
  iVar3 = *(int *)(lVar1 + 4);
  uVar6 = *(uint *)(lVar1 + 8);
  uVar5 = *(uint *)(lVar1 + 0xc);
  if (iVar3 == 0x68747541) {
    uVar6 = uVar6 ^ 0x69746e65;
    uVar5 = uVar5 ^ 0x444d4163;
  }
  else {
    if (iVar3 != 0x69444d41) {
      if (iVar3 == 0x756e6547) {
        if (uVar5 == 0x6c65746e && uVar6 == 0x49656e69) {
          *l3 = 0;
          *l2 = 0;
          *l1 = 0;
          uVar6 = 0;
          while( true ) {
            puVar2 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
            uVar5 = *puVar2;
            uVar4 = puVar2[1];
            if (((uVar5 & 0xd) == 1) &&
               (((uVar8 = uVar5 >> 5 & 7, piVar7 = l1, uVar8 == 1 || (piVar7 = l3, uVar8 == 3)) ||
                (piVar7 = l2, uVar8 == 2)))) {
              *piVar7 = (puVar2[3] + 1) * ((uVar4 >> 0x16) + 1) *
                        ((uVar4 & 0xfff) + 1) * ((uVar4 >> 0xc & 0x3ff) + 1);
            }
            if ((uVar5 & 0xf) == 0) break;
            bVar9 = 0xe < uVar6;
            uVar6 = uVar6 + 1;
            if (bVar9) {
              return;
            }
          }
          return;
        }
      }
      else if (iVar3 < 4) {
        queryCacheSizes_intel_codes(l1,l2,l3);
        return;
      }
      goto LAB_0010fb32;
    }
    uVar6 = uVar6 ^ 0x74656273;
    uVar5 = uVar5 ^ 0x21726574;
  }
  if (uVar5 == 0 && uVar6 == 0) {
    lVar1 = cpuid(0x80000005);
    *l1 = *(int *)(lVar1 + 0xc) >> 0xe & 0xfffffc00;
    lVar1 = cpuid(0x80000006);
    iVar3 = *(int *)(lVar1 + 8);
    *l2 = *(int *)(lVar1 + 0xc) >> 6 & 0xfffffc00;
    *l3 = iVar3 * 2 & 0x1ff80000;
    return;
  }
LAB_0010fb32:
  *l3 = 0;
  *l2 = 0;
  *l1 = 0;
  uVar6 = 0;
  do {
    puVar2 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
    uVar5 = *puVar2;
    uVar4 = puVar2[1];
    if (((uVar5 & 0xd) == 1) &&
       (((uVar8 = uVar5 >> 5 & 7, piVar7 = l1, uVar8 == 1 || (piVar7 = l3, uVar8 == 3)) ||
        (piVar7 = l2, uVar8 == 2)))) {
      *piVar7 = (puVar2[3] + 1) * ((uVar4 >> 0x16) + 1) *
                ((uVar4 & 0xfff) + 1) * ((uVar4 >> 0xc & 0x3ff) + 1);
    }
  } while (((uVar5 & 0xf) != 0) && (bVar9 = uVar6 < 0xf, uVar6 = uVar6 + 1, bVar9));
  return;
}

Assistant:

inline void queryCacheSizes(int& l1, int& l2, int& l3)
{
  #ifdef EIGEN_CPUID
  int abcd[4];
  const int GenuineIntel[] = {0x756e6547, 0x49656e69, 0x6c65746e};
  const int AuthenticAMD[] = {0x68747541, 0x69746e65, 0x444d4163};
  const int AMDisbetter_[] = {0x69444d41, 0x74656273, 0x21726574}; // "AMDisbetter!"

  // identify the CPU vendor
  EIGEN_CPUID(abcd,0x0,0);
  int max_std_funcs = abcd[1];
  if(cpuid_is_vendor(abcd,GenuineIntel))
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);
  else if(cpuid_is_vendor(abcd,AuthenticAMD) || cpuid_is_vendor(abcd,AMDisbetter_))
    queryCacheSizes_amd(l1,l2,l3);
  else
    // by default let's use Intel's API
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);

  // here is the list of other vendors:
//   ||cpuid_is_vendor(abcd,"VIA VIA VIA ")
//   ||cpuid_is_vendor(abcd,"CyrixInstead")
//   ||cpuid_is_vendor(abcd,"CentaurHauls")
//   ||cpuid_is_vendor(abcd,"GenuineTMx86")
//   ||cpuid_is_vendor(abcd,"TransmetaCPU")
//   ||cpuid_is_vendor(abcd,"RiseRiseRise")
//   ||cpuid_is_vendor(abcd,"Geode by NSC")
//   ||cpuid_is_vendor(abcd,"SiS SiS SiS ")
//   ||cpuid_is_vendor(abcd,"UMC UMC UMC ")
//   ||cpuid_is_vendor(abcd,"NexGenDriven")
  #else
  l1 = l2 = l3 = -1;
  #endif
}